

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Transmitter_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Transmitter_PDU *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KString local_2d0;
  KString local_2b0;
  KString local_290;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Transmitter_PDU *local_18;
  Transmitter_PDU *this_local;
  
  local_18 = this;
  this_local = (Transmitter_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Transmitter PDU-\n");
  Radio_Communications_Header::GetAsString_abi_cxx11_
            (&local_1f0,&this->super_Radio_Communications_Header);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"Radio Entity Type:          ");
  DATA_TYPE::RadioEntityType::GetAsString_abi_cxx11_(&local_210,&this->m_RadioEntityType);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"Transmit State:             ");
  DATA_TYPE::ENUMS::GetEnumAsStringTransmitState_abi_cxx11_
            (&local_230,(ENUMS *)(ulong)this->m_ui8TransmitterState,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Input Source:               ");
  DATA_TYPE::ENUMS::GetEnumAsStringRadioInputSource_abi_cxx11_
            (&local_250,(ENUMS *)(ulong)this->m_ui8InputSource,Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  poVar1 = std::operator<<(poVar1,"\n");
  DATA_TYPE::AntennaLocation::GetAsString_abi_cxx11_(&local_270,&this->m_AntennaLocation);
  poVar1 = std::operator<<(poVar1,(string *)&local_270);
  poVar1 = std::operator<<(poVar1,"Antenna Pattern Type:       ");
  DATA_TYPE::ENUMS::GetEnumAsStringAntennaPatternType_abi_cxx11_
            (&local_290,(ENUMS *)(ulong)this->m_ui16AntennaPatternType,Value_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_290);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Antenna Pattern Length:     ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16AntennaPatternLength);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Frequency(hertz):           ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui64Freq);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Transmit Frequency BW:      ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32TransmitFreqBW);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Power(decibel-milliwatts):  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Power);
  poVar1 = std::operator<<(poVar1,"\n");
  DATA_TYPE::ModulationType::GetAsString_abi_cxx11_(&local_2b0,&this->m_ModulationType);
  poVar1 = std::operator<<(poVar1,(string *)&local_2b0);
  DATA_TYPE::CryptoSystem::GetAsString_abi_cxx11_(&local_2d0,&this->m_CryptoSystem);
  poVar1 = std::operator<<(poVar1,(string *)&local_2d0);
  poVar1 = std::operator<<(poVar1,"Length Of Modulation Param: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8LengthOfModulationParam);
  poVar1 = std::operator<<(poVar1,"\n");
  std::operator<<(poVar1,"Variable Params.......NOT IMPLEMENTED\n");
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Transmitter_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Transmitter PDU-\n"
       << Radio_Communications_Header::GetAsString()
       << "Radio Entity Type:          " << m_RadioEntityType.GetAsString()
       << "Transmit State:             " << GetEnumAsStringTransmitState ( m_ui8TransmitterState )<< "\n"
       << "Input Source:               " << GetEnumAsStringRadioInputSource( m_ui8InputSource )   << "\n"
       << m_AntennaLocation.GetAsString()
       << "Antenna Pattern Type:       " << GetEnumAsStringAntennaPatternType( m_ui16AntennaPatternType ) << "\n"
       << "Antenna Pattern Length:     " << m_ui16AntennaPatternLength << "\n"
       << "Frequency(hertz):           " << m_ui64Freq                 << "\n"
       << "Transmit Frequency BW:      " << m_f32TransmitFreqBW        << "\n"
       << "Power(decibel-milliwatts):  " << m_f32Power                 << "\n"
       << m_ModulationType.GetAsString()
       << m_CryptoSystem.GetAsString()
       << "Length Of Modulation Param: " << ( KUINT16 )m_ui8LengthOfModulationParam << "\n"
       << "Variable Params.......NOT IMPLEMENTED\n";

    // TODO: Interpretation of the variable params is not provided at the moment. Karl

    return ss.str();
}